

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O0

void * __thiscall
btHashedOverlappingPairCache::removeOverlappingPair
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1,
          btDispatcher *dispatcher)

{
  void *pvVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  btBroadphasePair *pbVar7;
  btBroadphasePair *pbVar8;
  int *piVar9;
  undefined8 in_RCX;
  btBroadphaseProxy *in_RDX;
  btBroadphaseProxy *in_RSI;
  btHashedOverlappingPairCache *in_RDI;
  int lastHash;
  btBroadphasePair *last;
  int lastPairIndex;
  int previous;
  int index;
  int pairIndex;
  void *userData;
  btBroadphasePair *pair;
  int hash;
  int proxyId2;
  int proxyId1;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  btBroadphaseProxy *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int local_54;
  int local_50;
  btBroadphaseProxy *local_20;
  btBroadphaseProxy *local_18 [2];
  void *local_8;
  
  gRemovePairs = gRemovePairs + 1;
  local_20 = in_RDX;
  local_18[0] = in_RSI;
  if (in_RDX->m_uniqueId < in_RSI->m_uniqueId) {
    btSwap<btBroadphaseProxy*>(local_18,&local_20);
  }
  uVar2 = btBroadphaseProxy::getUid(local_18[0]);
  uVar3 = btBroadphaseProxy::getUid(local_20);
  uVar2 = getHash(in_RDI,uVar2,uVar3);
  iVar4 = btAlignedObjectArray<btBroadphasePair>::capacity(&in_RDI->m_overlappingPairArray);
  uVar3 = uVar2 & iVar4 - 1U;
  pbVar7 = internalFindPair((btHashedOverlappingPairCache *)
                            CONCAT44(uVar2,in_stack_ffffffffffffff88),in_stack_ffffffffffffff80,
                            (btBroadphaseProxy *)
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                            in_stack_ffffffffffffff74);
  if (pbVar7 == (btBroadphasePair *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    (*(in_RDI->super_btOverlappingPairCache).super_btOverlappingPairCallback.
      _vptr_btOverlappingPairCallback[8])(in_RDI,pbVar7,in_RCX);
    pvVar1 = (pbVar7->field_3).m_internalInfo1;
    pbVar8 = btAlignedObjectArray<btBroadphasePair>::operator[](&in_RDI->m_overlappingPairArray,0);
    iVar4 = (int)((long)pbVar7 - (long)pbVar8 >> 5);
    piVar9 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar3);
    local_50 = *piVar9;
    local_54 = -1;
    while (local_50 != iVar4) {
      local_54 = local_50;
      piVar9 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,local_50);
      local_50 = *piVar9;
    }
    if (local_54 == -1) {
      piVar9 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,iVar4);
      iVar5 = *piVar9;
      piVar9 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar3);
      *piVar9 = iVar5;
    }
    else {
      piVar9 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,iVar4);
      iVar5 = *piVar9;
      piVar9 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,local_54);
      *piVar9 = iVar5;
    }
    iVar5 = btAlignedObjectArray<btBroadphasePair>::size(&in_RDI->m_overlappingPairArray);
    iVar5 = iVar5 + -1;
    if (in_RDI->m_ghostPairCallback != (btOverlappingPairCallback *)0x0) {
      (*in_RDI->m_ghostPairCallback->_vptr_btOverlappingPairCallback[3])
                (in_RDI->m_ghostPairCallback,local_18[0],local_20,in_RCX);
    }
    local_8 = pvVar1;
    if (iVar5 == iVar4) {
      btAlignedObjectArray<btBroadphasePair>::pop_back(&in_RDI->m_overlappingPairArray);
    }
    else {
      pbVar7 = btAlignedObjectArray<btBroadphasePair>::operator[]
                         (&in_RDI->m_overlappingPairArray,iVar5);
      uVar2 = btBroadphaseProxy::getUid(pbVar7->m_pProxy0);
      uVar3 = btBroadphaseProxy::getUid(pbVar7->m_pProxy1);
      uVar2 = getHash(in_RDI,uVar2,uVar3);
      iVar6 = btAlignedObjectArray<btBroadphasePair>::capacity(&in_RDI->m_overlappingPairArray);
      uVar2 = uVar2 & iVar6 - 1U;
      piVar9 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar2);
      local_50 = *piVar9;
      local_54 = -1;
      while (local_50 != iVar5) {
        local_54 = local_50;
        piVar9 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,local_50);
        local_50 = *piVar9;
      }
      if (local_54 == -1) {
        piVar9 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,iVar5);
        iVar6 = *piVar9;
        piVar9 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar2);
        *piVar9 = iVar6;
      }
      else {
        piVar9 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,iVar5);
        iVar6 = *piVar9;
        piVar9 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,local_54);
        *piVar9 = iVar6;
      }
      pbVar7 = btAlignedObjectArray<btBroadphasePair>::operator[]
                         (&in_RDI->m_overlappingPairArray,iVar5);
      pbVar8 = btAlignedObjectArray<btBroadphasePair>::operator[]
                         (&in_RDI->m_overlappingPairArray,iVar4);
      pbVar8->m_pProxy0 = pbVar7->m_pProxy0;
      pbVar8->m_pProxy1 = pbVar7->m_pProxy1;
      pbVar8->m_algorithm = pbVar7->m_algorithm;
      pbVar8->field_3 = pbVar7->field_3;
      piVar9 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar2);
      iVar5 = *piVar9;
      piVar9 = btAlignedObjectArray<int>::operator[](&in_RDI->m_next,iVar4);
      *piVar9 = iVar5;
      piVar9 = btAlignedObjectArray<int>::operator[](&in_RDI->m_hashTable,uVar2);
      *piVar9 = iVar4;
      btAlignedObjectArray<btBroadphasePair>::pop_back(&in_RDI->m_overlappingPairArray);
    }
  }
  return local_8;
}

Assistant:

void* btHashedOverlappingPairCache::removeOverlappingPair(btBroadphaseProxy* proxy0, btBroadphaseProxy* proxy1,btDispatcher* dispatcher)
{
	gRemovePairs++;
	if(proxy0->m_uniqueId>proxy1->m_uniqueId) 
		btSwap(proxy0,proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2) 
		btSwap(proxyId1, proxyId2);*/

	int	hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1),static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity()-1));

	btBroadphasePair* pair = internalFindPair(proxy0, proxy1, hash);
	if (pair == NULL)
	{
		return 0;
	}

	cleanOverlappingPair(*pair,dispatcher);

	void* userData = pair->m_internalInfo1;

	btAssert(pair->m_pProxy0->getUid() == proxyId1);
	btAssert(pair->m_pProxy1->getUid() == proxyId2);

	int pairIndex = int(pair - &m_overlappingPairArray[0]);
	btAssert(pairIndex < m_overlappingPairArray.size());

	// Remove the pair from the hash table.
	int index = m_hashTable[hash];
	btAssert(index != BT_NULL_PAIR);

	int previous = BT_NULL_PAIR;
	while (index != pairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_NULL_PAIR)
	{
		btAssert(m_next[previous] == pairIndex);
		m_next[previous] = m_next[pairIndex];
	}
	else
	{
		m_hashTable[hash] = m_next[pairIndex];
	}

	// We now move the last pair into spot of the
	// pair being removed. We need to fix the hash
	// table indices to support the move.

	int lastPairIndex = m_overlappingPairArray.size() - 1;

	if (m_ghostPairCallback)
		m_ghostPairCallback->removeOverlappingPair(proxy0, proxy1,dispatcher);

	// If the removed pair is the last pair, we are done.
	if (lastPairIndex == pairIndex)
	{
		m_overlappingPairArray.pop_back();
		return userData;
	}

	// Remove the last pair from the hash table.
	const btBroadphasePair* last = &m_overlappingPairArray[lastPairIndex];
		/* missing swap here too, Nat. */ 
	int lastHash = static_cast<int>(getHash(static_cast<unsigned int>(last->m_pProxy0->getUid()), static_cast<unsigned int>(last->m_pProxy1->getUid())) & (m_overlappingPairArray.capacity()-1));

	index = m_hashTable[lastHash];
	btAssert(index != BT_NULL_PAIR);

	previous = BT_NULL_PAIR;
	while (index != lastPairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_NULL_PAIR)
	{
		btAssert(m_next[previous] == lastPairIndex);
		m_next[previous] = m_next[lastPairIndex];
	}
	else
	{
		m_hashTable[lastHash] = m_next[lastPairIndex];
	}

	// Copy the last pair into the remove pair's spot.
	m_overlappingPairArray[pairIndex] = m_overlappingPairArray[lastPairIndex];

	// Insert the last pair into the hash table
	m_next[pairIndex] = m_hashTable[lastHash];
	m_hashTable[lastHash] = pairIndex;

	m_overlappingPairArray.pop_back();

	return userData;
}